

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_step(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  global_State *g;
  global_State *pgVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  lu_mem lVar10;
  GCObject **ppGVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  GCObject **old;
  long lVar17;
  GCObject *dummy;
  GCObject *local_38;
  
  g = L->l_G;
  if (g->gcstp != '\0') {
    uVar15 = 0xfffffffffffff830;
    goto LAB_00143727;
  }
  uVar15 = g->lastatomic;
  if (g->gckind == '\x01') {
    if (uVar15 != 0) {
      enterinc(g);
LAB_00143306:
      luaC_runtilstate(L,1);
      lVar10 = atomic(L);
      if ((uVar15 >> 3) + uVar15 <= lVar10) {
        g->GCestimate = g->GCdebt + g->totalbytes;
        pgVar6 = L->l_G;
        pgVar6->gcstate = '\x03';
        ppGVar11 = &pgVar6->allgc;
        do {
          ppGVar11 = sweeplist(L,ppGVar11,1,(int *)0x0);
        } while (ppGVar11 == &pgVar6->allgc);
        pgVar6->sweepgc = ppGVar11;
        luaC_runtilstate(L,0x100);
        uVar13 = (ulong)g->gcpause * 4;
        uVar15 = g->GCestimate / 100;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar15;
        lVar12 = uVar15 * uVar13;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar7,0) <= uVar13) {
          lVar12 = 0x7fffffffffffffff;
        }
        uVar15 = (g->GCdebt + g->totalbytes) - lVar12;
        luaE_setdebt(g,(long)uVar15 >> 0x3f & uVar15);
        g->lastatomic = lVar10;
        return;
      }
      atomic2gen(L,g);
      uVar15 = -((ulong)g->genminormul * ((ulong)(g->GCdebt + g->totalbytes) / 100));
      goto LAB_00143727;
    }
    uVar13 = g->GCestimate;
    if ((g->GCdebt < 1) ||
       (uVar16 = (ulong)g->genmajormul * (uVar13 / 100) * 4,
       (ulong)(g->GCdebt + g->totalbytes) <= uVar16 + uVar13)) {
      if (g->firstold1 != (GCObject *)0x0) {
        markold(g,g->firstold1,g->reallyold);
        g->firstold1 = (GCObject *)0x0;
      }
      markold(g,g->finobj,g->finobjrold);
      markold(g,g->tobefnz,(GCObject *)0x0);
      atomic(L);
      g->gcstate = '\x03';
      uVar1._0_1_ = g->currentwhite;
      uVar1._1_1_ = g->gcstate;
      uVar1._2_1_ = g->gckind;
      uVar1._3_1_ = g->gcstopem;
      ppGVar11 = sweepgen(L,(global_State *)(ulong)uVar1,&g->allgc,g->survival,&g->firstold1);
      uVar2._0_1_ = g->currentwhite;
      uVar2._1_1_ = g->gcstate;
      uVar2._2_1_ = g->gckind;
      uVar2._3_1_ = g->gcstopem;
      sweepgen(L,(global_State *)(ulong)uVar2,ppGVar11,g->old1,&g->firstold1);
      g->reallyold = g->old1;
      g->old1 = *ppGVar11;
      g->survival = g->allgc;
      local_38 = (GCObject *)0x0;
      uVar3._0_1_ = g->currentwhite;
      uVar3._1_1_ = g->gcstate;
      uVar3._2_1_ = g->gckind;
      uVar3._3_1_ = g->gcstopem;
      ppGVar11 = sweepgen(L,(global_State *)(ulong)uVar3,&g->finobj,g->finobjsur,&local_38);
      uVar4._0_1_ = g->currentwhite;
      uVar4._1_1_ = g->gcstate;
      uVar4._2_1_ = g->gckind;
      uVar4._3_1_ = g->gcstopem;
      sweepgen(L,(global_State *)(ulong)uVar4,ppGVar11,g->finobjold1,&local_38);
      g->finobjrold = g->finobjold1;
      g->finobjold1 = *ppGVar11;
      g->finobjsur = g->finobj;
      uVar5._0_1_ = g->currentwhite;
      uVar5._1_1_ = g->gcstate;
      uVar5._2_1_ = g->gckind;
      uVar5._3_1_ = g->gcstopem;
      sweepgen(L,(global_State *)(ulong)uVar5,&g->tobefnz,(GCObject *)0x0,&local_38);
      finishgencycle(L,g);
      luaE_setdebt(g,-((ulong)g->genminormul * ((ulong)(g->GCdebt + g->totalbytes) / 100)));
      g->GCestimate = uVar13;
      return;
    }
    enterinc(g);
    lVar10 = entergen(L,g);
    uVar15 = g->GCdebt + g->totalbytes;
    if (uVar15 < (uVar16 >> 1) + uVar13) {
      return;
    }
    g->lastatomic = lVar10;
    uVar16 = (ulong)g->gcpause * 4;
    uVar13 = g->GCestimate / 100;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar13;
    lVar12 = uVar13 * uVar16;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar8,0) <= uVar16) {
      lVar12 = 0x7fffffffffffffff;
    }
    uVar15 = uVar15 - lVar12;
  }
  else {
    if (uVar15 != 0) goto LAB_00143306;
    lVar12 = (ulong)g->gcstepmul * 4 + 1;
    lVar17 = ((ulong)g->GCdebt >> 4) * lVar12;
    lVar14 = ((ulong)(1L << (g->gcstepsize & 0x3f)) >> 4) * lVar12;
    if (0x3e < g->gcstepsize) {
      lVar14 = 0x7fffffffffffffff;
    }
    do {
      lVar10 = singlestep(L);
      lVar17 = lVar17 - lVar10;
      if (lVar17 == -lVar14 || SBORROW8(lVar17,-lVar14) != lVar17 + lVar14 < 0) {
        if (g->gcstate != '\b') {
          uVar15 = lVar17 / lVar12 << 4;
          goto LAB_00143727;
        }
        break;
      }
    } while (g->gcstate != '\b');
    uVar13 = (ulong)g->gcpause * 4;
    uVar15 = g->GCestimate / 100;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar15;
    lVar12 = 0x7fffffffffffffff;
    if (uVar13 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar9,0)) {
      lVar12 = uVar15 * uVar13;
    }
    uVar15 = (g->GCdebt + g->totalbytes) - lVar12;
  }
  uVar15 = (long)uVar15 >> 0x3f & uVar15;
LAB_00143727:
  luaE_setdebt(g,uVar15);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  if (!gcrunning(g))  /* not running? */
    luaE_setdebt(g, -2000);
  else {
    if(isdecGCmodegen(g))
      genstep(L, g);
    else
      incstep(L, g);
  }
}